

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

uint64_t __thiscall flatbuffers::BinaryAnnotator::GetElementSize(BinaryAnnotator *this,Field *field)

{
  ushort uVar1;
  Field *pFVar2;
  uint64_t uVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  Schema *pSVar8;
  unsigned_short vtsize;
  long lVar9;
  Schema *pSVar10;
  
  lVar7 = -(long)*(int *)field;
  uVar5 = *(ushort *)(field + -(long)*(int *)field);
  if (uVar5 < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(field + lVar7 + 6);
  }
  if (uVar1 == 0) {
    pFVar2 = (Field *)0x0;
  }
  else {
    pFVar2 = field + (ulong)*(uint *)(field + uVar1) + (ulong)uVar1;
  }
  if (*(ushort *)(pFVar2 + -(long)*(int *)pFVar2) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(pFVar2 + (6 - (long)*(int *)pFVar2));
  }
  if ((uVar1 != 0) && ((int)(char)pFVar2[uVar1].super_Table - 1U < 0xc)) {
    if (uVar5 < 7) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(field + lVar7 + 6);
    }
    if (uVar5 == 0) {
      pFVar2 = (Field *)0x0;
    }
    else {
      pFVar2 = field + (ulong)*(uint *)(field + uVar5) + (ulong)uVar5;
    }
    if (*(ushort *)(pFVar2 + -(long)*(int *)pFVar2) < 7) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pFVar2 + (6 - (long)*(int *)pFVar2));
    }
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(uint)(int)(char)pFVar2[uVar5].super_Table;
    }
    return (&GetTypeSize(reflection::BaseType)::sizes)[uVar4];
  }
  if (uVar5 < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(field + lVar7 + 6);
  }
  if (uVar1 == 0) {
    pFVar2 = (Field *)0x0;
  }
  else {
    pFVar2 = field + (ulong)*(uint *)(field + uVar1) + (ulong)uVar1;
  }
  if (*(ushort *)(pFVar2 + -(long)*(int *)pFVar2) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(pFVar2 + (6 - (long)*(int *)pFVar2));
  }
  uVar3 = 4;
  if ((uVar1 != 0) && (pFVar2[uVar1].super_Table == (Table)0xf)) {
    pSVar10 = this->schema_;
    if (*(ushort *)(pSVar10 + -(long)*(int *)pSVar10) < 5) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(pSVar10 + (4 - (long)*(int *)pSVar10));
    }
    if (uVar1 == 0) {
      pSVar10 = (Schema *)0x0;
    }
    else {
      pSVar10 = pSVar10 + (ulong)*(uint *)(pSVar10 + uVar1) + (ulong)uVar1;
    }
    if (uVar5 < 7) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(field + lVar7 + 6);
    }
    if (uVar5 == 0) {
      pFVar2 = (Field *)0x0;
    }
    else {
      pFVar2 = field + (ulong)*(uint *)(field + uVar5) + (ulong)uVar5;
    }
    if (*(ushort *)(pFVar2 + -(long)*(int *)pFVar2) < 9) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pFVar2 + (8 - (long)*(int *)pFVar2));
    }
    if (uVar5 == 0) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = *(uint *)(pFVar2 + uVar5);
    }
    if (*(uint *)pSVar10 <= uVar6) {
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                   );
    }
    lVar7 = (ulong)*(uint *)(pSVar10 + (ulong)(uVar6 << 2) + 4) + (ulong)(uVar6 << 2);
    pSVar8 = pSVar10 + lVar7 + 4;
    lVar9 = -(long)*(int *)pSVar8;
    if (*(ushort *)(pSVar8 + -(long)*(int *)pSVar8) < 9) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar10 + lVar9 + lVar7 + 0xc);
    }
    if ((uVar5 != 0) && (pSVar8[uVar5].super_Table != (Table)0x0)) {
      if (*(ushort *)(pSVar8 + -(long)*(int *)pSVar8) < 0xd) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(pSVar10 + lVar9 + lVar7 + 0x10);
      }
      if (uVar5 == 0) {
        return 0;
      }
      uVar3 = (uint64_t)*(int *)(pSVar8 + uVar5);
    }
  }
  return uVar3;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}